

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzrule.cpp
# Opt level: O1

UBool __thiscall
icu_63::InitialTimeZoneRule::isEquivalentTo(InitialTimeZoneRule *this,TimeZoneRule *other)

{
  char *__s1;
  char *__s2;
  UBool UVar1;
  int iVar2;
  
  if (&this->super_TimeZoneRule == other) {
    UVar1 = '\x01';
  }
  else {
    __s1 = *(char **)((this->super_TimeZoneRule).super_UObject._vptr_UObject[-1] + 8);
    __s2 = *(char **)((other->super_UObject)._vptr_UObject[-1] + 8);
    if (__s1 == __s2) {
LAB_002186e8:
      UVar1 = TimeZoneRule::isEquivalentTo(&this->super_TimeZoneRule,other);
      return UVar1;
    }
    if (*__s1 != '*') {
      iVar2 = strcmp(__s1,__s2);
      if (iVar2 == 0) goto LAB_002186e8;
    }
    UVar1 = '\0';
  }
  return UVar1;
}

Assistant:

UBool
InitialTimeZoneRule::isEquivalentTo(const TimeZoneRule& other) const {
    if (this == &other) {
        return TRUE;
    }
    if (typeid(*this) != typeid(other) || TimeZoneRule::isEquivalentTo(other) == FALSE) {
        return FALSE;
    }
    return TRUE;
}